

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int,std::vector<int,std::allocator<int>>>
               (AVisitor<hiberlite::KillChildren> *ar,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *m,uint param_3)

{
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_128;
  stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_> local_d8;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  body;
  uint param_2_local;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *m_local;
  AVisitor<hiberlite::KillChildren> *ar_local;
  
  body.stream.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = param_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"items",&local_91);
  stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>::stl_map_adapter(&local_d8,m);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp((collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)local_70,(string *)local_90,&local_d8);
  stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>::~stl_map_adapter(&local_d8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp(&local_128,
                   (collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)local_70);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_128);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::~collection_nvp(&local_128);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::~collection_nvp((collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
                     *)local_70);
  return;
}

Assistant:

void hibernate(A& ar, std::map<Key,Data>& m, const unsigned int)
{
	typedef std::pair<Key,Data> ElType;
	collection_nvp<ElType,stl_map_adapter<Key,Data> >
			body( "items", stl_map_adapter<Key,Data>(m) );
	ar & body;
}